

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall
HEkk::updatePivots(HEkk *this,HighsInt variable_in,HighsInt row_out,HighsInt move_out)

{
  uint64_t *hash;
  HighsInt *pHVar1;
  double dVar2;
  double dVar3;
  HighsInt index;
  int iVar4;
  pointer pdVar5;
  char cVar6;
  
  HighsSimplexAnalysis::simplexTimerStart(&this->analysis_,0x4f,0);
  index = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[row_out];
  hash = &(this->basis_).hash;
  HighsHashHelpers::sparse_inverse_combine(hash,index);
  HighsHashHelpers::sparse_combine(hash,variable_in);
  HighsHashTable<unsigned_long,void>::insert<unsigned_long&>
            ((HighsHashTable<unsigned_long,void> *)&this->visited_basis_,hash);
  (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[row_out] = variable_in;
  (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_start[variable_in] = '\0';
  (this->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_start[variable_in] = '\0';
  (this->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[row_out] =
       (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[variable_in];
  (this->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[row_out] =
       (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[variable_in];
  (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_start[index] = '\x01';
  dVar2 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[index];
  dVar3 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[index];
  if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
    pdVar5 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (move_out == -1) {
      pdVar5[index] = dVar2;
      cVar6 = '\x01';
    }
    else {
      pdVar5[index] = dVar3;
      cVar6 = -1;
    }
  }
  else {
    (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[index] = dVar2;
    cVar6 = '\0';
  }
  (this->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_start[index] = cVar6;
  (this->info_).updated_dual_objective_value =
       (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[index] *
       (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[index] + (this->info_).updated_dual_objective_value;
  pHVar1 = &(this->info_).update_count;
  *pHVar1 = *pHVar1 + 1;
  iVar4 = (this->lp_).num_col_;
  if (index < iVar4) {
    pHVar1 = &(this->info_).num_basic_logicals;
    *pHVar1 = *pHVar1 + 1;
  }
  if (variable_in < iVar4) {
    pHVar1 = &(this->info_).num_basic_logicals;
    *pHVar1 = *pHVar1 + -1;
  }
  (this->status_).has_invert = false;
  (this->status_).has_fresh_invert = false;
  (this->status_).has_fresh_rebuild = false;
  HighsSimplexAnalysis::simplexTimerStop(&this->analysis_,0x4f,0);
  return;
}

Assistant:

void HEkk::updatePivots(const HighsInt variable_in, const HighsInt row_out,
                        const HighsInt move_out) {
  analysis_.simplexTimerStart(UpdatePivotsClock);
  HighsInt variable_out = basis_.basicIndex_[row_out];

  // update hash value of basis
  HighsHashHelpers::sparse_inverse_combine(basis_.hash, variable_out);
  HighsHashHelpers::sparse_combine(basis_.hash, variable_in);
  visited_basis_.insert(basis_.hash);

  // Incoming variable
  basis_.basicIndex_[row_out] = variable_in;
  basis_.nonbasicFlag_[variable_in] = 0;
  basis_.nonbasicMove_[variable_in] = 0;
  info_.baseLower_[row_out] = info_.workLower_[variable_in];
  info_.baseUpper_[row_out] = info_.workUpper_[variable_in];

  // Outgoing variable
  basis_.nonbasicFlag_[variable_out] = 1;
  if (info_.workLower_[variable_out] == info_.workUpper_[variable_out]) {
    info_.workValue_[variable_out] = info_.workLower_[variable_out];
    basis_.nonbasicMove_[variable_out] = 0;
  } else if (move_out == -1) {
    info_.workValue_[variable_out] = info_.workLower_[variable_out];
    basis_.nonbasicMove_[variable_out] = 1;
  } else {
    info_.workValue_[variable_out] = info_.workUpper_[variable_out];
    basis_.nonbasicMove_[variable_out] = -1;
  }
  // Update the dual objective value
  double nwValue = info_.workValue_[variable_out];
  double vrDual = info_.workDual_[variable_out];
  double dl_dual_objective_value = nwValue * vrDual;
  info_.updated_dual_objective_value += dl_dual_objective_value;
  info_.update_count++;
  // Update the number of basic logicals
  if (variable_out < lp_.num_col_) info_.num_basic_logicals++;
  if (variable_in < lp_.num_col_) info_.num_basic_logicals--;
  // No longer have a representation of B^{-1}, and certainly not
  // fresh!
  status_.has_invert = false;
  status_.has_fresh_invert = false;
  // Data are no longer fresh from rebuild
  status_.has_fresh_rebuild = false;
  analysis_.simplexTimerStop(UpdatePivotsClock);
}